

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O1

float Assimp::FBX::ParseTokenAsFloat(Token *t)

{
  float fVar1;
  char *err;
  allocator local_39;
  char *local_38;
  string local_30;
  
  fVar1 = ParseTokenAsFloat(t,&local_38);
  if (local_38 == (char *)0x0) {
    return fVar1;
  }
  std::__cxx11::string::string((string *)&local_30,local_38,&local_39);
  anon_unknown.dwarf_227350::ParseError(&local_30,t);
}

Assistant:

float ParseTokenAsFloat(const Token& t)
{
    const char* err;
    const float i = ParseTokenAsFloat(t,err);
    if(err) {
        ParseError(err,t);
    }
    return i;
}